

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_invalid_path(void)

{
  int iVar1;
  int extraout_EAX;
  uv_fs_event_t *loop;
  uv_loop_t *loop_00;
  
  loop = (uv_fs_event_t *)uv_default_loop();
  iVar1 = uv_fs_event_init((uv_loop_t *)loop,&fs_event);
  if (iVar1 == 0) {
    loop = &fs_event;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar1 == 0) goto LAB_0014f4e6;
    loop = &fs_event;
    iVar1 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar1 != 0) goto LAB_0014f4eb;
    loop = &fs_event;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar1 == 0) goto LAB_0014f4f0;
    loop = &fs_event;
    iVar1 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar1 == 0) {
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = (uv_fs_event_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014f4fa;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_0014f4e6:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_0014f4eb:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_0014f4f0:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_0014f4fa:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_watch_invalid_path) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "<:;", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  MAKE_VALGRIND_HAPPY();
  return 0;
}